

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,MemoryCopy *curr)

{
  bool bVar1;
  Memory *pMVar2;
  Memory *pMVar3;
  MemoryCopy *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  pMVar2 = Module::getMemory(this->wasm,(Name)(curr->destMemory).super_IString.str);
  pMVar3 = Module::getMemory(this->wasm,(Name)(curr->sourceMemory).super_IString.str);
  bVar1 = wasm::Type::operator==(&pMVar2->addressType,&pMVar3->addressType);
  if (!bVar1) {
    __assert_fail("wasm.getMemory(curr->destMemory)->addressType == wasm.getMemory(curr->sourceMemory)->addressType"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x122,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy(MemoryCopy *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  notePointer(this,&curr->dest,(Name)(curr->destMemory).super_IString.str);
  notePointer(this,&curr->source,(Name)(curr->sourceMemory).super_IString.str);
  notePointer(this,&curr->size,(Name)(curr->destMemory).super_IString.str);
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    assert(wasm.getMemory(curr->destMemory)->addressType ==
           wasm.getMemory(curr->sourceMemory)->addressType);
    notePointer(&curr->dest, curr->destMemory);
    notePointer(&curr->source, curr->sourceMemory);
    notePointer(&curr->size, curr->destMemory);
  }